

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O0

int CfdCreateExtPubkey(void *handle,char *extkey,int network_type,char **ext_pubkey)

{
  bool bVar1;
  undefined8 uVar2;
  CfdException *this;
  char *pcVar3;
  undefined8 *in_RCX;
  char *in_RSI;
  CfdException *except;
  exception *std_except;
  string key;
  HDWalletApi api;
  NetType net_type;
  bool is_bitcoin;
  string *in_stack_fffffffffffffe60;
  undefined8 in_stack_fffffffffffffe68;
  CfdError error_code;
  allocator *paVar4;
  CfdException *in_stack_fffffffffffffe70;
  bool *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb4;
  allocator local_139;
  string local_138 [32];
  string local_118 [37];
  HDWalletApi local_f3;
  undefined1 local_f2;
  allocator local_f1;
  string local_f0 [32];
  CfdSourceLocation local_d0;
  NetType local_b8;
  byte local_b3;
  undefined1 local_b2;
  allocator local_b1;
  string local_b0 [32];
  CfdSourceLocation local_90;
  undefined1 local_72;
  allocator local_71;
  string local_70 [32];
  char *local_50;
  int local_48;
  NetType in_stack_ffffffffffffffbc;
  string *in_stack_ffffffffffffffc0;
  HDWalletApi *in_stack_ffffffffffffffc8;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffe68 >> 0x20);
  cfd::Initialize();
  if (in_RCX == (undefined8 *)0x0) {
    local_50 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_key.cpp"
                       ,0x2f);
    local_50 = local_50 + 1;
    local_48 = 0x75f;
    cfd::core::logger::warn<>((CfdSourceLocation *)&local_50,"extpubkey is null.");
    local_72 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    paVar4 = &local_71;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"Failed to parameter. extpubkey is null.",paVar4);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffe70,error_code,in_stack_fffffffffffffe60);
    local_72 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(in_RSI);
  if (!bVar1) {
    local_b3 = 1;
    local_b8 = cfd::capi::ConvertNetType(in_stack_fffffffffffffeb4,in_stack_fffffffffffffea8);
    if ((local_b3 & 1) == 0) {
      local_d0.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_key.cpp"
                   ,0x2f);
      local_d0.filename = local_d0.filename + 1;
      local_d0.line = 0x76e;
      local_d0.funcname = "CfdCreateExtPubkey";
      cfd::core::logger::warn<>(&local_d0,"privkey\'s network_type is invalid.");
      local_f2 = 1;
      this = (CfdException *)__cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_f0,"Failed to parameter. privkey\'s network_type is invalid.",&local_f1);
      cfd::core::CfdException::CfdException(this,error_code,in_stack_fffffffffffffe60);
      local_f2 = 0;
      __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    cfd::api::HDWalletApi::HDWalletApi(&local_f3);
    paVar4 = &local_139;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_138,in_RSI,paVar4);
    cfd::api::HDWalletApi::CreateExtPubkey
              (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    std::__cxx11::string::~string(local_138);
    std::allocator<char>::~allocator((allocator<char> *)&local_139);
    pcVar3 = cfd::capi::CreateString
                       ((string *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    *in_RCX = pcVar3;
    std::__cxx11::string::~string(local_118);
    return 0;
  }
  local_90.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_key.cpp"
               ,0x2f);
  local_90.filename = local_90.filename + 1;
  local_90.line = 0x765;
  local_90.funcname = "CfdCreateExtPubkey";
  cfd::core::logger::warn<>(&local_90,"extkey is null or empty.");
  local_b2 = 1;
  uVar2 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"Failed to parameter. extkey is null or empty.",&local_b1);
  cfd::core::CfdException::CfdException
            (in_stack_fffffffffffffe70,error_code,in_stack_fffffffffffffe60);
  local_b2 = 0;
  __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdCreateExtPubkey(
    void* handle, const char* extkey, int network_type, char** ext_pubkey) {
  try {
    cfd::Initialize();
    if (ext_pubkey == nullptr) {
      warn(CFD_LOG_SOURCE, "extpubkey is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. extpubkey is null.");
    }
    if (IsEmptyString(extkey)) {
      warn(CFD_LOG_SOURCE, "extkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. extkey is null or empty.");
    }

    bool is_bitcoin = true;
    cfd::core::NetType net_type = ConvertNetType(network_type, &is_bitcoin);
    if (!is_bitcoin) {
      warn(CFD_LOG_SOURCE, "privkey's network_type is invalid.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. privkey's network_type is invalid.");
    }
    HDWalletApi api;
    std::string key = api.CreateExtPubkey(extkey, net_type);
    *ext_pubkey = CreateString(key);

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}